

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make<cs::numeric,int>(int *args)

{
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *this;
  proxy *dat;
  proxy *in_RDI;
  proxy *args_00;
  allocator_type<cs_impl::any::holder<cs::numeric>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_ffffffffffffffe0;
  
  args_00 = in_RDI;
  this = (allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *)
         cs::
         allocator_type<cs_impl::any::holder<cs::numeric>,_64UL,_cs_impl::default_allocator_provider>
         ::alloc<int>(in_stack_ffffffffffffffe0,(int *)in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,cs_impl::any::holder<cs::numeric>*>
                  (this,(int *)args_00,(holder<cs::numeric> **)in_RDI);
  any((any *)in_RDI,dat);
  return (any)args_00;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}